

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::append_member_name
          (string *__return_storage_ptr__,CompilerMSL *this,string *qualifier,SPIRType *type,
          uint32_t index)

{
  bool bVar1;
  undefined4 in_register_00000084;
  allocator local_85 [13];
  string local_78 [32];
  long local_58;
  size_t startPos;
  string mbr_name;
  BuiltIn builtin;
  uint32_t index_local;
  SPIRType *type_local;
  string *qualifier_local;
  CompilerMSL *this_local;
  
  mbr_name.field_2._8_4_ = 0x7fffffff;
  mbr_name.field_2._12_4_ = index;
  bVar1 = Compiler::is_member_builtin
                    ((Compiler *)this,type,index,(BuiltIn *)(mbr_name.field_2._M_local_buf + 8));
  if (bVar1) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (__return_storage_ptr__,this,(ulong)(uint)mbr_name.field_2._8_4_,(ulong)type->storage)
    ;
  }
  else {
    CompilerGLSL::to_member_name_abi_cxx11_
              ((string *)&startPos,&this->super_CompilerGLSL,type,mbr_name.field_2._12_4_);
    local_58 = ::std::__cxx11::string::find_first_not_of((char *)&startPos,0x66305e);
    bVar1 = local_58 == -1;
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,"",local_85);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_78,(ulong)&startPos);
    }
    ::std::__cxx11::string::operator=((string *)&startPos,local_78);
    ::std::__cxx11::string::~string(local_78);
    if (bVar1) {
      ::std::allocator<char>::~allocator((allocator<char> *)local_85);
    }
    join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,(spirv_cross *)qualifier,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e,
               (char (*) [2])&startPos,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_register_00000084,index));
    ::std::__cxx11::string::~string((string *)&startPos);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::append_member_name(const string &qualifier, const SPIRType &type, uint32_t index)
{
	// Don't qualify Builtin names because they are unique and are treated as such when building expressions
	BuiltIn builtin = BuiltInMax;
	if (is_member_builtin(type, index, &builtin))
		return builtin_to_glsl(builtin, type.storage);

	// Strip any underscore prefix from member name
	string mbr_name = to_member_name(type, index);
	size_t startPos = mbr_name.find_first_not_of("_");
	mbr_name = (startPos != string::npos) ? mbr_name.substr(startPos) : "";
	return join(qualifier, "_", mbr_name);
}